

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O2

void Dtt_EnumerateLf(int nVars,int nNodeMax,int fDelay,int fMulti,int fVerbose,char *pFileName)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Wec_t *pVVar2;
  int i;
  uint uVar3;
  int i_00;
  uint uVar4;
  int iVar5;
  abctime clk;
  Dtt_Man_t *p_01;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  int i_01;
  int nNodes;
  long lVar9;
  int i_02;
  int i_03;
  int i_04;
  uint tFun;
  uint tFun_00;
  ulong uVar10;
  word nMultis;
  uint tFun_01;
  uint tFun_02;
  word nSteps;
  
  clk = Abc_Clock();
  p_01 = Dtt_ManAlloc(nVars,fMulti);
  pVVar6 = p_01->vFanins;
  lVar9 = 0;
  Vec_IntPushTwo(pVVar6,0,0);
  pVVar7 = p_01->vTruths;
  Vec_IntPush(pVVar7,0);
  pVVar1 = p_01->vConfigs;
  Vec_IntPush(pVVar1,0);
  p = p_01->vClasses;
  p_00 = p_01->vTruthNpns;
  Vec_IntPush(p,p_00->nSize);
  Vec_IntPush(p_00,0);
  *p_01->pPres = *p_01->pPres | 1;
  pVVar2 = p_01->vFunNodes;
  Vec_WecPush(pVVar2,0,pVVar6->nSize / 2);
  Vec_IntPushTwo(pVVar6,0,0);
  Vec_IntPush(pVVar7,-0x55555556);
  Vec_IntPush(pVVar1,0);
  Vec_IntPush(p,p_00->nSize);
  Vec_IntPush(p_00,-0x55555556);
  uVar10 = 0;
  if (0 < nVars) {
    uVar10 = (ulong)(uint)nVars;
  }
  for (; uVar10 * 8 != lVar9; lVar9 = lVar9 + 8) {
    Dtt_ManSetFun(p_01,*(uint *)((long)s_Truths6 + lVar9));
  }
  p_01->Counts[0] = 2;
  nMultis = 0;
  Dtt_PrintStats(0,nVars,pVVar2,0,clk,fDelay,0);
  if (nNodeMax < 1) {
    nNodeMax = 0;
  }
  nNodes = 1;
  nSteps = 0;
  do {
    if (nNodes == nNodeMax + 1) break;
    iVar8 = nNodes + -1;
    for (i_01 = 0; i_01 != nNodes; i_01 = i_01 + 1) {
      if (i_01 <= iVar8) {
        pVVar2 = p_01->vFunNodes;
        pVVar6 = Vec_WecEntry(pVVar2,i_01);
        pVVar7 = Vec_WecEntry(pVVar2,iVar8);
        for (i_04 = 0; i_04 < pVVar6->nSize; i_04 = i_04 + 1) {
          i = Vec_IntEntry(pVVar6,i_04);
          uVar3 = Vec_IntEntry(p_01->vTruths,i);
          pVVar1 = p_01->vTemp;
          Dtt_ManCollect(p_01,uVar3,pVVar1);
          i_02 = 0;
          if (i_01 == iVar8) {
            i_02 = i_04;
          }
          for (; i_02 < pVVar7->nSize; i_02 = i_02 + 1) {
            i_00 = Vec_IntEntry(pVVar7,i_02);
            uVar3 = Vec_IntEntry(p_01->vTruths,i_00);
            for (i_03 = 0; i_03 < pVVar1->nSize; i_03 = i_03 + 1) {
              uVar4 = Vec_IntEntry(pVVar1,i_03);
              tFun_01 = uVar4 & uVar3;
              iVar5 = Dtt_ManGetFun(p_01,tFun_01,nNodes);
              if (iVar5 == 0) {
                Dtt_ManAddFunction(p_01,nNodes,i,i_00,0,tFun_01);
              }
              tFun_02 = ~uVar4 & uVar3;
              iVar5 = Dtt_ManGetFun(p_01,tFun_02,nNodes);
              if (iVar5 == 0) {
                Dtt_ManAddFunction(p_01,nNodes,i,i_00,1,tFun_02);
              }
              tFun = uVar4 & ~uVar3;
              iVar5 = Dtt_ManGetFun(p_01,tFun,nNodes);
              if (iVar5 == 0) {
                Dtt_ManAddFunction(p_01,nNodes,i,i_00,2,tFun);
              }
              tFun_00 = uVar4 | uVar3;
              iVar5 = Dtt_ManGetFun(p_01,tFun_00,nNodes);
              if (iVar5 == 0) {
                Dtt_ManAddFunction(p_01,nNodes,i,i_00,3,tFun_00);
              }
              uVar4 = uVar4 ^ uVar3;
              iVar5 = Dtt_ManGetFun(p_01,uVar4,nNodes);
              if (iVar5 == 0) {
                Dtt_ManAddFunction(p_01,nNodes,i,i_00,4,uVar4);
              }
              if (p_01->pTable != (uint *)0x0) {
                Dtt_ManAddVisited(p_01,tFun_01,nNodes);
                Dtt_ManAddVisited(p_01,tFun_02,nNodes);
                Dtt_ManAddVisited(p_01,tFun,nNodes);
                Dtt_ManAddVisited(p_01,tFun_00,nNodes);
                Dtt_ManAddVisited(p_01,uVar4,nNodes);
              }
              nSteps = nSteps + 5;
            }
            if (p_01->pTable != (uint *)0x0) {
              Dtt_ManProcessVisited(p_01);
            }
            nMultis = nMultis + 1;
          }
        }
      }
      iVar8 = iVar8 + fDelay + -1;
    }
    iVar8 = Dtt_PrintStats(nNodes,nVars,p_01->vFunNodes,nSteps,clk,fDelay,nMultis);
    nNodes = nNodes + 1;
  } while (iVar8 != 0);
  if (fDelay == 0) {
    if (pFileName != (char *)0x0) {
      Dtt_DumpLibrary(p_01,pFileName);
    }
  }
  else {
    Dtt_PrintDistrib(p_01);
  }
  Dtt_ManFree(p_01);
  return;
}

Assistant:

void Dtt_EnumerateLf( int nVars, int nNodeMax, int fDelay, int fMulti, int fVerbose, char* pFileName )
{
    abctime clk = Abc_Clock(); word nSteps = 0, nMultis = 0;
    Dtt_Man_t * p = Dtt_ManAlloc( nVars, fMulti ); int n, i, j;

    // constant zero class
    Vec_IntPushTwo( p->vFanins, 0, 0 );
    Vec_IntPush( p->vTruths, 0 );
    Vec_IntPush( p->vConfigs, 0 );
    Vec_IntPush( p->vClasses, Vec_IntSize(p->vTruthNpns) );
    Vec_IntPush( p->vTruthNpns, 0 );
    Dtt_ManSetFun( p, 0 );
    // buffer class
    Vec_WecPush( p->vFunNodes, 0, Vec_IntSize(p->vFanins)/2 );
    Vec_IntPushTwo( p->vFanins, 0, 0 );
    Vec_IntPush( p->vTruths, (unsigned)s_Truths6[0] );
    Vec_IntPush( p->vConfigs, 0 );
    Vec_IntPush( p->vClasses, Vec_IntSize(p->vTruthNpns) );
    Vec_IntPush( p->vTruthNpns, (unsigned)s_Truths6[0] );
    for ( i = 0; i < nVars; i++ )
        Dtt_ManSetFun( p, (unsigned)s_Truths6[i] );
    p->Counts[0] = 2;
    // enumerate
    Dtt_PrintStats(0, nVars, p->vFunNodes, nSteps, clk, fDelay, 0);
    for ( n = 1; n <= nNodeMax; n++ )
    {
        for ( i = 0, j = n - 1; i < n; i++, j = j - 1 + fDelay ) if ( i <= j )
        {
            Vec_Int_t * vFaninI = Vec_WecEntry( p->vFunNodes, i );
            Vec_Int_t * vFaninJ = Vec_WecEntry( p->vFunNodes, j );
            int k, i0, j0, EntryI, EntryJ;
            Vec_IntForEachEntry( vFaninI, EntryI, i0 )
            {
                unsigned TruthI = Vec_IntEntry(p->vTruths, EntryI);
                Vec_Int_t * vFuns = Dtt_ManCollect( p, TruthI, p->vTemp );
                int Start = i == j ? i0 : 0;
                Vec_IntForEachEntryStart( vFaninJ, EntryJ, j0, Start )
                {
                    unsigned Truth, TruthJ = Vec_IntEntry(p->vTruths, EntryJ);
                    Vec_IntForEachEntry( vFuns, Truth, k )
                    {
                        if ( !Dtt_ManGetFun(p,  TruthJ &  Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 0,  TruthJ &  Truth );
                        if ( !Dtt_ManGetFun(p,  TruthJ & ~Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 1,  TruthJ & ~Truth );
                        if ( !Dtt_ManGetFun(p, ~TruthJ &  Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 2, ~TruthJ &  Truth );
                        if ( !Dtt_ManGetFun(p,  TruthJ |  Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 3,  TruthJ |  Truth );
                        if ( !Dtt_ManGetFun(p,  TruthJ ^  Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 4,  TruthJ ^  Truth );
                        nSteps += 5;

                        if ( p->pTable ) Dtt_ManAddVisited( p,  TruthJ &  Truth, n );
                        if ( p->pTable ) Dtt_ManAddVisited( p,  TruthJ & ~Truth, n );
                        if ( p->pTable ) Dtt_ManAddVisited( p, ~TruthJ &  Truth, n );
                        if ( p->pTable ) Dtt_ManAddVisited( p,  TruthJ |  Truth, n );
                        if ( p->pTable ) Dtt_ManAddVisited( p,  TruthJ ^  Truth, n );
                    }
                    nMultis++;
                    if ( p->pTable ) Dtt_ManProcessVisited( p );
                }
            }
        }
        if ( Dtt_PrintStats(n, nVars, p->vFunNodes, nSteps, clk, fDelay, nMultis) == 0 )
            break;
    }
    if ( fDelay )
        Dtt_PrintDistrib( p );
    //if ( p->pTable ) 
        //Dtt_PrintMulti( p );
    if ( !fDelay && pFileName!=NULL )
        Dtt_DumpLibrary( p, pFileName );
    Dtt_ManFree( p );
}